

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O0

unique_ptr<void_*[],_std::default_delete<void_*[]>_> __thiscall
StackTraceTableTestHelper::DumpTraces(StackTraceTableTestHelper *this)

{
  _func_StackTrace_ptr_void_ptr_ptr *next_fn;
  pointer head;
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  *in_RSI;
  _lambda_void_const____1_ local_1a;
  undefined1 local_19;
  StackTraceTableTestHelper *this_local;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> *retval;
  
  local_19 = 0;
  this_local = this;
  next_fn = DumpTraces()::{lambda(void_const**)#1}::operator_cast_to_function_pointer(&local_1a);
  head = std::
         unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
         ::get(in_RSI);
  tcmalloc::ProduceStackTracesDump((tcmalloc *)this,next_fn,head);
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::reset(in_RSI,(pointer)0x0);
  return (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)
         (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<void*[]> DumpTraces() {
    auto retval = ProduceStackTracesDump(
      +[] (const void** current_head) {
        const Entry* head = static_cast<const Entry*>(*current_head);
        *current_head = head->next.get();
        return &head->trace;
      }, head_.get());

    head_.reset();
    return retval;
  }